

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_gauss_s2_precomputed(integral_image *iimage,interest_point *ipoint)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int s;
  int iVar8;
  int col;
  int iVar9;
  int row;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float __x;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 extraout_var [60];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 in_register_00001444 [12];
  int local_e0;
  int local_d8;
  float local_98;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar12._8_4_ = 0x3effffff;
  auVar12._0_8_ = 0x3effffff3effffff;
  auVar12._12_4_ = 0x3effffff;
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  fVar17 = ipoint->scale;
  auVar34 = ZEXT464((uint)fVar17);
  iVar9 = 0;
  lVar6 = 0;
  local_e0 = 0;
  auVar10 = vpternlogd_avx512vl(auVar12,ZEXT416((uint)fVar17),auVar18,0xf8);
  auVar10 = ZEXT416((uint)(fVar17 + auVar10._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  s = (int)(auVar10._0_4_ + auVar10._0_4_);
  auVar10 = vpternlogd_avx512vl(auVar12,ZEXT416((uint)ipoint->x),auVar18,0xf8);
  auVar11 = vpternlogd_avx512vl(auVar12,ZEXT416((uint)ipoint->y),auVar18,0xf8);
  auVar14._0_8_ = (double)fVar17;
  auVar14._8_8_ = 0;
  auVar10 = ZEXT416((uint)(ipoint->x + auVar10._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  auVar13._0_8_ = (double)auVar10._0_4_;
  auVar13._8_8_ = auVar10._8_8_;
  auVar18 = vfmadd231sd_fma(auVar13,auVar14,ZEXT816(0x3fe0000000000000));
  auVar35 = ZEXT1664(CONCAT124(auVar18._4_12_,(float)auVar18._0_8_));
  auVar32 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
  auVar10 = ZEXT416((uint)(ipoint->y + auVar11._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  auVar11._0_8_ = (double)auVar10._0_4_;
  auVar11._8_8_ = auVar10._8_8_;
  auVar10 = vfmadd231sd_fma(auVar11,auVar14,ZEXT816(0x3fe0000000000000));
  auVar33 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  __x = 0.0;
  iVar3 = -8;
  do {
    auVar28._0_4_ = (float)iVar3;
    auVar28._4_12_ = in_register_00001444;
    lVar5 = (long)local_e0;
    lVar6 = (long)(int)lVar6;
    iVar8 = -8;
    local_d8 = -3;
    auVar11 = vfmadd213ss_fma(auVar28,auVar34._0_16_,auVar35._0_16_);
    local_e0 = local_e0 + 4;
    auVar12 = vpternlogd_avx512vl(auVar32._0_16_,auVar11,auVar33._0_16_,0xf8);
    auVar11 = ZEXT416((uint)(auVar11._0_4_ + auVar12._0_4_));
    auVar11 = vroundss_avx(auVar11,auVar11,0xb);
    auVar26._0_4_ = (int)auVar11._0_4_;
    auVar26._4_4_ = (int)auVar11._4_4_;
    auVar26._8_4_ = (int)auVar11._8_4_;
    auVar26._12_4_ = (int)auVar11._12_4_;
    auVar11 = vcvtdq2ps_avx(auVar26);
    do {
      auVar19._0_4_ = (float)iVar8;
      auVar19._4_12_ = in_register_00001444;
      auVar12 = vfmadd213ss_fma(auVar19,auVar34._0_16_,ZEXT416((uint)(float)auVar10._0_8_));
      iVar4 = iVar8 + -4;
      auVar31 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar13 = vpternlogd_avx512vl(auVar32._0_16_,auVar12,auVar33._0_16_,0xf8);
      auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
      auVar12 = vroundss_avx(auVar12,auVar12,0xb);
      auVar20._0_4_ = (int)auVar12._0_4_;
      auVar20._4_4_ = (int)auVar12._4_4_;
      auVar20._8_4_ = (int)auVar12._8_4_;
      auVar20._12_4_ = (int)auVar12._12_4_;
      auVar12 = vcvtdq2ps_avx(auVar20);
      do {
        auVar21._0_4_ = (float)iVar4;
        auVar21._4_12_ = in_register_00001444;
        auVar13 = vfmadd213ss_fma(auVar21,auVar34._0_16_,ZEXT416((uint)(float)auVar10._0_8_));
        iVar7 = -0xc;
        auVar14 = vpternlogd_avx512vl(auVar32._0_16_,auVar13,auVar33._0_16_,0xf8);
        local_98 = auVar12._0_4_;
        auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar14._0_4_));
        auVar13 = vroundss_avx(auVar13,auVar13,0xb);
        row = (int)auVar13._0_4_;
        auVar22._0_4_ = (int)auVar13._0_4_;
        auVar22._4_4_ = (int)auVar13._4_4_;
        auVar22._8_4_ = (int)auVar13._8_4_;
        auVar22._12_4_ = (int)auVar13._12_4_;
        auVar13 = vcvtdq2ps_avx(auVar22);
        local_98 = local_98 - auVar13._0_4_;
        do {
          auVar23._0_4_ = (float)(iVar9 + iVar7);
          auVar23._4_12_ = in_register_00001444;
          auVar13 = vfmadd213ss_fma(auVar23,auVar34._0_16_,auVar35._0_16_);
          auVar14 = vpternlogd_avx512vl(auVar32._0_16_,auVar13,auVar33._0_16_,0xf8);
          auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar14._0_4_));
          auVar13 = vroundss_avx(auVar13,auVar13,0xb);
          col = (int)auVar13._0_4_;
          auVar24._0_4_ = (int)auVar13._0_4_;
          auVar24._4_4_ = (int)auVar13._4_4_;
          auVar24._8_4_ = (int)auVar13._8_4_;
          auVar24._12_4_ = (int)auVar13._12_4_;
          auVar13 = vcvtdq2ps_avx(auVar24);
          fVar15 = auVar11._0_4_ - auVar13._0_4_;
          fVar15 = expf((-0.08 / (fVar17 * fVar17)) * (fVar15 * fVar15 + local_98 * local_98));
          fVar16 = haarX_improved(iimage,row,col,s);
          auVar32._0_4_ = haarY_improved(iimage,row,col,s);
          auVar32._4_60_ = extraout_var;
          auVar13 = vinsertps_avx(auVar32._0_16_,ZEXT416((uint)fVar16),0x10);
          auVar29._8_4_ = 0x7fffffff;
          auVar29._0_8_ = 0x7fffffff7fffffff;
          auVar29._12_4_ = 0x7fffffff;
          auVar33 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar32 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar35 = ZEXT464((uint)(float)auVar18._0_8_);
          auVar34 = ZEXT1664(ZEXT416((uint)fVar17));
          iVar7 = iVar7 + 1;
          auVar25._0_4_ = fVar15 * auVar13._0_4_;
          auVar25._4_4_ = fVar15 * auVar13._4_4_;
          auVar25._8_4_ = fVar15 * auVar13._8_4_;
          auVar25._12_4_ = fVar15 * auVar13._12_4_;
          auVar13 = vandps_avx(auVar25,auVar29);
          local_48 = auVar31._0_4_;
          fStack_44 = auVar31._4_4_;
          fStack_40 = auVar31._8_4_;
          fStack_3c = auVar31._12_4_;
          auVar13 = vmovlhps_avx(auVar25,auVar13);
          auVar30._0_4_ = local_48 + auVar13._0_4_;
          auVar30._4_4_ = fStack_44 + auVar13._4_4_;
          auVar30._8_4_ = fStack_40 + auVar13._8_4_;
          auVar30._12_4_ = fStack_3c + auVar13._12_4_;
          auVar31 = ZEXT1664(auVar30);
        } while (iVar7 != -3);
        iVar4 = iVar4 + 1;
      } while (iVar4 != local_d8);
      local_d8 = local_d8 + 5;
      fVar15 = gauss_s2_arr[lVar5];
      auVar2._4_4_ = fVar15;
      auVar2._0_4_ = fVar15;
      auVar2._8_4_ = fVar15;
      auVar2._12_4_ = fVar15;
      auVar14 = vmulps_avx512vl(auVar30,auVar2);
      iVar8 = iVar8 + 5;
      lVar5 = lVar5 + 1;
      auVar27._0_4_ = auVar14._0_4_ * auVar14._0_4_;
      auVar27._4_4_ = auVar14._4_4_ * auVar14._4_4_;
      auVar27._8_4_ = auVar14._8_4_ * auVar14._8_4_;
      auVar27._12_4_ = auVar14._12_4_ * auVar14._12_4_;
      auVar13 = vshufpd_avx(auVar14,auVar14,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar6) = auVar14;
      lVar6 = lVar6 + 4;
      auVar12 = vmovshdup_avx(auVar27);
      auVar12 = vfmadd231ss_fma(auVar12,auVar14,auVar14);
      auVar13 = vfmadd213ss_fma(auVar13,auVar13,auVar12);
      auVar12 = vshufps_avx(auVar14,auVar14,0xff);
      auVar12 = vfmadd213ss_fma(auVar12,auVar12,auVar13);
      __x = __x + auVar12._0_4_;
    } while (local_e0 != (int)lVar5);
    iVar9 = iVar9 + 5;
    bVar1 = iVar3 < 3;
    iVar3 = iVar3 + 5;
  } while (bVar1);
  if (__x < 0.0) {
    fVar17 = sqrtf(__x);
  }
  else {
    auVar10 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
    fVar17 = auVar10._0_4_;
  }
  lVar6 = 0;
  auVar32 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar17)));
  do {
    auVar33 = vmulps_avx512f(auVar32,*(undefined1 (*) [64])(ipoint->descriptor + lVar6));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar6) = auVar33;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_gauss_s2_precomputed(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - use array gauss_s2_precomputed and index gauss_s2_index for precomputed gauss_s2 values

    ideas:
        - 
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
     // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get the gaussian weighted x and y responses
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}